

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double lerch(double a,double b,double c)

{
  double dVar1;
  double sum2_old;
  double sum2;
  double dStack_28;
  int k;
  double a_k;
  double c_local;
  double b_local;
  double a_local;
  
  sum2_old = 0.0;
  sum2._4_4_ = 0;
  dStack_28 = 1.0;
  while( true ) {
    while( true ) {
      if ((c + (double)sum2._4_4_ != 0.0) || (NAN(c + (double)sum2._4_4_))) break;
      sum2._4_4_ = sum2._4_4_ + 1;
      dStack_28 = dStack_28 * a;
    }
    dVar1 = pow(c + (double)sum2._4_4_,b);
    dVar1 = sum2_old + dStack_28 / dVar1;
    if (dVar1 <= sum2_old) break;
    sum2._4_4_ = sum2._4_4_ + 1;
    dStack_28 = dStack_28 * a;
    sum2_old = dVar1;
  }
  return dVar1;
}

Assistant:

double lerch ( double a, double b, double c )

//****************************************************************************80
//
//  Purpose:
//
//    LERCH estimates the Lerch transcendent function.
//
//  Discussion:
//
//    The Lerch transcendent function is defined as:
//
//      LERCH ( A, B, C ) = Sum ( 0 <= K < Infinity ) A^K / ( C + K )^B
//
//    excluding any term with ( C + K ) = 0.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Eric Weisstein, editor,
//    CRC Concise Encylopedia of Mathematics,
//    CRC Press, 1998.
//
//  Thanks:
//
//    Oscar van Vlijmen
//
//  Parameters:
//
//    Input, double A, B, C, the parameters of the function.
//
//    Output, double LERCH, an approximation to the Lerch
//    transcendent function.
//
{
  double a_k;
  int k;
  double sum2;
  double sum2_old;

  sum2 = 0.0;
  k = 0;
  a_k = 1.0;

  for ( ; ; )
  {
    sum2_old = sum2;

    if ( c + static_cast<double>(k ) == 0.0 )
    {
      k = k + 1;
      a_k = a_k * a;
      continue;
    }

    sum2 = sum2 + a_k / pow ( c + static_cast<double>(k ), b );

    if ( sum2 <= sum2_old )
    {
      break;
    }

    k = k + 1;
    a_k = a_k * a;
  }
  return sum2;
}